

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgShader.cpp
# Opt level: O2

void __thiscall rsg::Shader::Shader(Shader *this,Type type)

{
  this->m_type = type;
  VariableScope::VariableScope(&this->m_globalScope);
  (this->m_functions).super__Vector_base<rsg::Function_*,_std::allocator<rsg::Function_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_functions).super__Vector_base<rsg::Function_*,_std::allocator<rsg::Function_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_uniforms).super__Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_functions).super__Vector_base<rsg::Function_*,_std::allocator<rsg::Function_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_uniforms).super__Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_uniforms).super__Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_inputs).super__Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_inputs).super__Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_globalStatements).super__Vector_base<rsg::Statement_*,_std::allocator<rsg::Statement_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_inputs).super__Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_globalStatements).super__Vector_base<rsg::Statement_*,_std::allocator<rsg::Statement_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_globalStatements).super__Vector_base<rsg::Statement_*,_std::allocator<rsg::Statement_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  Function::Function(&this->m_mainFunction,"main");
  (this->m_source)._M_dataplus._M_p = (pointer)&(this->m_source).field_2;
  (this->m_source)._M_string_length = 0;
  (this->m_source).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

Shader::Shader (Type type)
	: m_type			(type)
	, m_mainFunction	("main")
{
}